

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O2

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::ProcessTRow::operator()
          (ProcessTRow *this,iterator_t *str,iterator_t end)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  TransitionModelDiscrete *pTVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ParserDPOMDPFormat_Spirit *pPVar8;
  ostream *poVar9;
  E *pEVar10;
  uint *puVar11;
  uint uVar12;
  uint uVar13;
  uint *puVar14;
  vector<double,_std::allocator<double>_> row;
  stringstream ss;
  ostream local_1a8 [376];
  
  pPVar8 = this->_m_po;
  if ((long)(pPVar8->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pPVar8->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start != 4) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar9 = std::operator<<(local_1a8,"ProcessTRow:_m_lp_fromSI has size != 1. (at ");
    poVar9 = DPOMDPFormatParsing::operator<<(poVar9,&str->_pos);
    poVar9 = std::operator<<(poVar9,")");
    std::endl<char,std::char_traits<char>>(poVar9);
    pEVar10 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar10,&ss);
    __cxa_throw(pEVar10,&E::typeinfo,E::~E);
  }
  bVar5 = IsRowMatrixLP(pPVar8);
  if (bVar5) {
    std::vector<double,_std::allocator<double>_>::vector
              (&row,(this->_m_po->_m_curMatrix).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    uVar6 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->
                                   super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x30))();
    if ((long)row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 == uVar6) {
      pPVar8 = this->_m_po;
      puVar11 = (pPVar8->_m_lp_fromSI).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (*puVar11 == pPVar8->_m_anyStateIndex) {
        if ((pPVar8->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar11) {
          (pPVar8->_m_lp_fromSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar11;
        }
        uVar12 = 0;
        while( true ) {
          _ss = uVar12;
          uVar7 = (**(code **)(*(long *)&(pPVar8->_m_decPOMDPDiscrete->
                                         super_MultiAgentDecisionProcessDiscrete).
                                         super_MultiAgentDecisionProcess + 0x30))();
          if (uVar7 <= uVar12) break;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&this->_m_po->_m_lp_fromSI,(value_type_conflict1 *)&ss);
          pPVar8 = this->_m_po;
          uVar12 = _ss + 1;
        }
        pPVar8 = this->_m_po;
        puVar11 = (pPVar8->_m_lp_fromSI).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      puVar2 = (pPVar8->_m_lp_fromSI).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (; puVar11 != puVar2; puVar11 = puVar11 + 1) {
        uVar12 = *puVar11;
        puVar3 = (this->_m_po->_m_lp_JAI).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar14 = (this->_m_po->_m_lp_JAI).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar14 != puVar3; puVar14 = puVar14 + 1) {
          uVar1 = *puVar14;
          for (uVar13 = 0; uVar7 = (ulong)uVar13, uVar7 < uVar6; uVar13 = uVar13 + 1) {
            pTVar4 = (this->_m_po->_m_decPOMDPDiscrete->super_MultiAgentDecisionProcessDiscrete).
                     _m_p_tModel;
            (*(pTVar4->super_TransitionModelDiscreteInterface).super_TransitionModel.
              _vptr_TransitionModel[5])
                      (row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7],pTVar4,(ulong)uVar12,(ulong)uVar1,
                       uVar7);
          }
        }
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&row.super__Vector_base<double,_std::allocator<double>_>);
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar9 = std::operator<<(local_1a8,"ProcessTRow: exected a row matrix with nrStates=");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," entries. Found ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    poVar9 = std::operator<<(poVar9," entries. (at ");
    poVar9 = DPOMDPFormatParsing::operator<<(poVar9,&str->_pos);
    poVar9 = std::operator<<(poVar9,")");
    std::endl<char,std::char_traits<char>>(poVar9);
    pEVar10 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar10,&ss);
    __cxa_throw(pEVar10,&E::typeinfo,E::~E);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar9 = std::operator<<(local_1a8,"ProcessTRow: a row matrix should have been parsed. (at ");
  poVar9 = DPOMDPFormatParsing::operator<<(poVar9,&str->_pos);
  poVar9 = std::operator<<(poVar9,")");
  std::endl<char,std::char_traits<char>>(poVar9);
  pEVar10 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar10,&ss);
  __cxa_throw(pEVar10,&E::typeinfo,E::~E);
}

Assistant:

void ParserDPOMDPFormat_Spirit::ProcessTRow::operator()(iterator_t str, iterator_t end) const
{
    if( _m_po->_m_lp_fromSI.size() != 1 )
    {
        stringstream ss; ss<<"ProcessTRow:_m_lp_fromSI has size != 1. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    if( !_m_po->IsRowMatrixLP() )
    {
        stringstream ss; ss<<"ProcessTRow: a row matrix should have been parsed. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    vector<double> row = _m_po->_m_curMatrix[0];
    size_t nrS = _m_po->GetDecPOMDPDiscrete()->GetNrStates();
    if( row.size() != nrS)
    {
        stringstream ss; ss<<"ProcessTRow: exected a row matrix with nrStates="<<nrS<<" entries. Found "<<row.size()<< " entries. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }

    Index sI = _m_po->_m_lp_fromSI[0];
    Index jaI = 0;
    if( sI == _m_po->_m_anyStateIndex )
    {
        _m_po->_m_lp_fromSI.clear();
        for(Index si=0; si < _m_po->GetDecPOMDPDiscrete()->GetNrStates();si++)
            _m_po->_m_lp_fromSI.push_back(si);
    }

    vector<Index>::iterator sI_it = _m_po->_m_lp_fromSI.begin();
    vector<Index>::iterator sI_last = _m_po->_m_lp_fromSI.end();
    while(sI_it != sI_last)
    {
        sI = *sI_it;
        vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
        vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
        while(jaI_it != jaI_last)
        {
            jaI = *jaI_it;
            for(Index sucSI=0; sucSI < nrS; sucSI++)
            {
                _m_po->GetDecPOMDPDiscrete()->SetTransitionProbability
                    (sI, jaI, sucSI, row[sucSI]);
                if(DEBUG_PARSE)
                    cout << "Setting T("<<sI<<","<<jaI<<","<<
                        sucSI<<") = "<<row[sucSI]<<endl;
            }
            jaI_it++;
        }
        sI_it++;
    }
}